

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qminimaleglscreen.cpp
# Opt level: O3

QRect __thiscall QMinimalEglScreen::geometry(QMinimalEglScreen *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 in_EAX;
  int iVar6;
  undefined1 auVar5 [16];
  
  uVar1 = (this->m_geometry).x1;
  uVar3 = (this->m_geometry).y1;
  uVar2 = (this->m_geometry).x2;
  uVar4 = (this->m_geometry).y2;
  auVar5._0_4_ = -(uint)(uVar2 == uVar1 + -1);
  iVar6 = -(uint)(uVar4 == uVar3 + -1);
  auVar5._4_4_ = auVar5._0_4_;
  auVar5._8_4_ = iVar6;
  auVar5._12_4_ = iVar6;
  iVar6 = movmskpd(in_EAX,auVar5);
  if (iVar6 == 3) {
    createAndSetPlatformContext(this);
  }
  return this->m_geometry;
}

Assistant:

QRect QMinimalEglScreen::geometry() const
{
    if (m_geometry.isNull()) {
        createAndSetPlatformContext();
    }
    return m_geometry;
}